

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O3

void __thiscall tonk::Connection::Shutdown(Connection *this)

{
  atomic<int> *paVar1;
  unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
  *this_00;
  FloodDetector *this_01;
  HostnameResolverState *pHVar2;
  tuple<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
  tVar3;
  _Head_base<0UL,_tonk::HostnameResolverState_*,_false> __ptr;
  strand *psVar4;
  ErrorResult *pEVar5;
  Result local_40;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Tonk shutdown","");
  pEVar5 = (ErrorResult *)operator_new(0x38);
  pEVar5->Source = "Connection::Shutdown";
  (pEVar5->Description)._M_dataplus._M_p = (pointer)&(pEVar5->Description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pEVar5->Description,local_38,local_38 + local_30);
  pEVar5->Type = Tonk;
  pEVar5->Code = 0xc;
  local_40.Error = pEVar5;
  RefCounter::StartShutdown(&(this->super_IConnection).SelfRefCount,0xc,&local_40);
  Result::~Result(&local_40);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  reportClose(this);
  removeFromMaps(this);
  this_01 = (this->Deps).DisconnectHandler;
  if (this_01 != (FloodDetector *)0x0) {
    FloodDetector::OnDisconnect(this_01,&(this->Deps).DisconnectAddrKey);
  }
  pHVar2 = (this->ResolverState)._M_t.
           super___uniq_ptr_impl<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
           ._M_t.
           super__Tuple_impl<0UL,_tonk::HostnameResolverState_*,_std::default_delete<tonk::HostnameResolverState>_>
           .super__Head_base<0UL,_tonk::HostnameResolverState_*,_false>._M_head_impl;
  if ((pHVar2 != (HostnameResolverState *)0x0) &&
     (tVar3.
      super__Tuple_impl<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
      .
      super__Head_base<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_false>
      ._M_head_impl =
           *(_Tuple_impl<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
             *)&(pHVar2->Resolver)._M_t.
                super___uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
     , tVar3.
       super__Tuple_impl<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
       .
       super__Head_base<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_false>
       ._M_head_impl !=
       (_Head_base<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_false>
        )0x0)) {
    this_00 = &this->ResolverState;
    std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::
    reset<void,asio::detail::socket_ops::noop_deleter>
              ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)
               ((long)tVar3.
                      super__Tuple_impl<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                      .
                      super__Head_base<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_false>
                      ._M_head_impl + 8));
    std::
    __uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
    ::reset((__uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
             *)&((this_00->_M_t).
                 super___uniq_ptr_impl<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_tonk::HostnameResolverState_*,_std::default_delete<tonk::HostnameResolverState>_>
                 .super__Head_base<0UL,_tonk::HostnameResolverState_*,_false>._M_head_impl)->
                Resolver,(pointer)0x0);
    __ptr._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
         ._M_t.
         super__Tuple_impl<0UL,_tonk::HostnameResolverState_*,_std::default_delete<tonk::HostnameResolverState>_>
         .super__Head_base<0UL,_tonk::HostnameResolverState_*,_false>._M_head_impl;
    (this_00->_M_t).
    super___uniq_ptr_impl<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
    ._M_t.
    super__Tuple_impl<0UL,_tonk::HostnameResolverState_*,_std::default_delete<tonk::HostnameResolverState>_>
    .super__Head_base<0UL,_tonk::HostnameResolverState_*,_false>._M_head_impl =
         (HostnameResolverState *)0x0;
    if (__ptr._M_head_impl != (HostnameResolverState *)0x0) {
      std::default_delete<tonk::HostnameResolverState>::operator()
                ((default_delete<tonk::HostnameResolverState> *)this_00,__ptr._M_head_impl);
    }
  }
  psVar4 = (this->AsioEventStrand)._M_t.
           super___uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::io_context::strand_*,_std::default_delete<asio::io_context::strand>_>
           .super__Head_base<0UL,_asio::io_context::strand_*,_false>._M_head_impl;
  (this->AsioEventStrand)._M_t.
  super___uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>.
  _M_t.
  super__Tuple_impl<0UL,_asio::io_context::strand_*,_std::default_delete<asio::io_context::strand>_>
  .super__Head_base<0UL,_asio::io_context::strand_*,_false>._M_head_impl = (strand *)0x0;
  if (psVar4 != (strand *)0x0) {
    operator_delete(psVar4);
  }
  std::
  __uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
  ::reset((__uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
           *)&this->Ticker,(pointer)0x0);
  std::__uniq_ptr_impl<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>::reset
            ((__uniq_ptr_impl<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_> *)
             &this->HolePuncher,(pointer)0x0);
  SessionIncoming::Shutdown(&this->Incoming);
  SessionOutgoing::Shutdown(&this->Outgoing);
  LOCK();
  paVar1 = &((this->Deps).SocketRefCount)->RefCount;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  return;
}

Assistant:

void Connection::Shutdown()
{
    TONK_DEBUG_ASSERT(!SelfRefCount.ObjectInUse());

    // Make sure that at least one Disconnect has occurred
    SelfRefCount.StartShutdown(
        Tonk_AppRequest,
        Result("Connection::Shutdown", "Tonk shutdown", ErrorType::Tonk, Tonk_AppRequest));

    reportClose();

    removeFromMaps();

    // If the flood detection subsystem needs to be notified of a disconnect:
    if (Deps.DisconnectHandler) {
        Deps.DisconnectHandler->OnDisconnect(Deps.DisconnectAddrKey);
    }

    if (ResolverState && ResolverState->Resolver)
    {
        ResolverState->Resolver->cancel();
        ResolverState->Resolver = nullptr;
        ResolverState = nullptr;
    }

    // Kill the strand
    AsioEventStrand = nullptr;
    Ticker = nullptr;
    HolePuncher = nullptr;

    // Shut down most connected objects first:

    Incoming.Shutdown();
    Outgoing.Shutdown();

#ifdef TONK_DETAILED_STATS

    Deets.WriteJsonToFile();
    Logger.Info("Detailed statistics consumed ", Deets.GetMemoryUsed(), " bytes");

#endif

    // Release reference to socket
    Deps.SocketRefCount->DecrementReferences();
}